

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_padding.cpp
# Opt level: O2

int test_padding(int w,int h,int c,int top,int bottom,int left,int right,int type,float value,
                int per_channel_pad_data_size)

{
  int iVar1;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  float a_00;
  float a_01;
  float in_XMM1_Da;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> weights;
  Option opt;
  Mat a;
  ParamDict pd;
  
  ncnn::Mat::Mat(&a,5,7,w,4,(Allocator *)0x0);
  Randomize(&a,a_00,in_XMM1_Da);
  ncnn::ParamDict::ParamDict(&pd);
  ncnn::ParamDict::set(&pd,0,h);
  ncnn::ParamDict::set(&pd,1,c);
  ncnn::ParamDict::set(&pd,2,top);
  ncnn::ParamDict::set(&pd,3,bottom);
  ncnn::ParamDict::set(&pd,4,left);
  ncnn::ParamDict::set(&pd,5,value);
  ncnn::ParamDict::set(&pd,6,right);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&weights,(ulong)(right != 0),(allocator_type *)&opt);
  if (right != 0) {
    ncnn::Mat::Mat((Mat *)&opt,right,4,(Allocator *)0x0);
    Randomize((Mat *)&opt,a_01,in_XMM1_Da);
    ncnn::Mat::operator=
              (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start,(Mat *)&opt);
    ncnn::Mat::~Mat((Mat *)&opt);
  }
  ncnn::Option::Option(&opt);
  opt.num_threads = 1;
  opt.use_int8_inference = false;
  opt.use_vulkan_compute = true;
  iVar1 = test_layer<ncnn::Padding>
                    ("Padding",&pd,&weights,&opt,&a,0.001,(_func_void_Padding_ptr *)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,
            "test_padding failed w=%d h=%d c=%d top=%d bottom=%d left=%d right=%d type=%d value=%f per_channel_pad_data_size=%d\n"
            ,(double)value,5,7,(ulong)(uint)w,h,CONCAT44(in_register_00000014,c),
            CONCAT44(in_register_0000000c,top),(ulong)(uint)bottom,(ulong)(uint)left,
            (ulong)(uint)right);
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&weights);
  ncnn::ParamDict::~ParamDict(&pd);
  ncnn::Mat::~Mat(&a);
  return iVar1;
}

Assistant:

static int test_padding(int w, int h, int c, int top, int bottom, int left, int right, int type, float value, int per_channel_pad_data_size)
{
    ncnn::Mat a = RandomMat(w, h, c);

    ncnn::ParamDict pd;
    pd.set(0, top);// top
    pd.set(1, bottom);// bottom
    pd.set(2, left);// left
    pd.set(3, right);// right
    pd.set(4, type);// type
    pd.set(5, value);// value
    pd.set(6, per_channel_pad_data_size);// per_channel_pad_data_size

    std::vector<ncnn::Mat> weights(per_channel_pad_data_size ? 1 : 0);
    if (per_channel_pad_data_size)
        weights[0] = RandomMat(per_channel_pad_data_size);

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_vulkan_compute = true;
    opt.use_int8_inference = false;

    int ret = test_layer<ncnn::Padding>("Padding", pd, weights, opt, a);
    if (ret != 0)
    {
        fprintf(stderr, "test_padding failed w=%d h=%d c=%d top=%d bottom=%d left=%d right=%d type=%d value=%f per_channel_pad_data_size=%d\n", w, h, c, top, bottom, left, right, type, value, per_channel_pad_data_size);
    }

    return ret;
}